

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::attach_shader(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLuint program;
  GLuint program_00;
  GLuint GVar2;
  GLuint program_01;
  string local_58;
  GLuint local_34;
  
  program = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_34 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  GVar2 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_01 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_01);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "GL_INVALID_OPERATION is generated if program is not a program object.","");
  NegativeTestContext::beginSection(ctx,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,program);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.","");
  NegativeTestContext::beginSection(ctx,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_00,program_00);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,program_00);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_00,GVar2);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_01,program);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_01,GVar2);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "GL_INVALID_OPERATION is generated if shader is already attached to program.","");
  NegativeTestContext::beginSection(ctx,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_00,program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_00,program);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "GL_INVALID_OPERATION is generated if a shader of the same type as shader is already attached to program."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  GVar2 = local_34;
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program_00,local_34);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
  return;
}

Assistant:

void attach_shader (NegativeTestContext& ctx)
{
	GLuint shader1 = ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint shader2 = ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint program = ctx.glCreateProgram();

	const GLuint notAShader = ctx.glCreateShader(GL_VERTEX_SHADER);
	const GLuint notAProgram = ctx.glCreateProgram();

	ctx.glDeleteShader(notAShader);
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glAttachShader(shader1, shader1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	ctx.glAttachShader(program, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glAttachShader(shader1, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL.");
	ctx.glAttachShader(program, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glAttachShader(notAProgram, shader1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glAttachShader(notAProgram, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is already attached to program.");
	ctx.glAttachShader(program, shader1);
	ctx.expectError(GL_NO_ERROR);
	ctx.glAttachShader(program, shader1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a shader of the same type as shader is already attached to program.");
	ctx.glAttachShader(program, shader2);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader1);
	ctx.glDeleteShader(shader2);
}